

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

int __thiscall QTabBarPrivate::indexAtPos(QTabBarPrivate *this,QPoint *p)

{
  QTabBar *this_00;
  char cVar1;
  int iVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBar **)&(this->super_QWidgetPrivate).field_0x8;
  local_48 = QTabBar::tabRect(this_00,this->currentIndex);
  cVar1 = QRect::contains((QPoint *)&local_48,SUB81(p,0));
  if (cVar1 == '\0') {
    iVar2 = -1;
    if ((this->tabList).d.size != 0) {
      uVar3 = 0;
      do {
        if (((this->tabList).d.ptr[uVar3]->field_0xe4 & 1) != 0) {
          local_48 = QTabBar::tabRect(this_00,(int)uVar3);
          cVar1 = QRect::contains((QPoint *)&local_48,SUB81(p,0));
          iVar2 = (int)uVar3;
          if (cVar1 != '\0') break;
        }
        uVar3 = uVar3 + 1;
        iVar2 = -1;
      } while (uVar3 < (ulong)(this->tabList).d.size);
    }
  }
  else {
    iVar2 = this->currentIndex;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int QTabBarPrivate::indexAtPos(const QPoint &p) const
{
    Q_Q(const QTabBar);
    if (q->tabRect(currentIndex).contains(p))
        return currentIndex;
    for (int i = 0; i < tabList.size(); ++i)
        if (tabList.at(i)->enabled && q->tabRect(i).contains(p))
            return i;
    return -1;
}